

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectoringNozzleSystem.h
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::VectoringNozzleSystem::VectoringNozzleSystem
          (VectoringNozzleSystem *this,VectoringNozzleSystem *param_1)

{
  KFLOAT32 KVar1;
  VectoringNozzleSystem *param_1_local;
  VectoringNozzleSystem *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__VectoringNozzleSystem_0032f808
  ;
  KVar1 = param_1->m_f32VDeflAngle;
  this->m_f32HDeflAngle = param_1->m_f32HDeflAngle;
  this->m_f32VDeflAngle = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT VectoringNozzleSystem : public DataTypeBase
{
protected:

    KFLOAT32 m_f32HDeflAngle;

    KFLOAT32 m_f32VDeflAngle;

public:

    static const KUINT16 VECTORING_NOZZLE_SYSTEM_SIZE = 8;

    VectoringNozzleSystem();

    VectoringNozzleSystem(KDataStream &stream) noexcept(false);

    VectoringNozzleSystem( KFLOAT32 HorizontalDeflectionAngle, KFLOAT32 VerticalDeflectionAngle );

    virtual ~VectoringNozzleSystem();

    //************************************
    // FullName:    KDIS::DATA_TYPE::VectoringNozzleSystem::SetHorizontalDeflectionAngle
    //              KDIS::DATA_TYPE::VectoringNozzleSystem::GetHorizontalDeflectionAngle
    // Description: Nozzle deflection angle in degrees in the horizontal body axis
    //              of the entity.
    // Parameter:   KFLOAT32  HDA, void
    //************************************
    void SetHorizontalDeflectionAngle( KFLOAT32 HDA );
    KFLOAT32 GetHorizontalDeflectionAngle() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::VectoringNozzleSystem::SetVerticalDeflectionAngle
    //              KDIS::DATA_TYPE::VectoringNozzleSystem::GetVerticalDeflectionAngle
    // Description: Nozzle deflection angle in degrees in the horizontal body axis
    //              of the entity.
    // Parameter:   KFLOAT32 VDA, void
    //************************************
    void SetVerticalDeflectionAngle( KFLOAT32 VDA );
    KFLOAT32 GetVerticalDeflectionAngle() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::VectoringNozzleSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::VectoringNozzleSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::VectoringNozzleSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const VectoringNozzleSystem & Value ) const;
    KBOOL operator != ( const VectoringNozzleSystem & Value ) const;
}